

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUTF16Transcoder.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XMLUTF16Transcoder::transcodeTo
          (XMLUTF16Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts param_6)

{
  XMLSize_t XVar1;
  ulong uVar2;
  
  uVar2 = maxBytes >> 1;
  if (srcCount <= maxBytes >> 1) {
    uVar2 = srcCount;
  }
  if (this->fSwapped == true) {
    if (uVar2 != 0) {
      XVar1 = 0;
      do {
        *(XMLCh *)(toFill + XVar1 * 2) = srcData[XVar1] << 8 | (ushort)srcData[XVar1] >> 8;
        XVar1 = XVar1 + 1;
      } while (uVar2 != XVar1);
    }
  }
  else {
    memcpy(toFill,srcData,uVar2 * 2);
  }
  *charsEaten = uVar2;
  return uVar2 * 2;
}

Assistant:

XMLSize_t
XMLUTF16Transcoder::transcodeTo(const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  chars that we can fit into the output buffer, and the source
    //  chars available.
    //
    const XMLSize_t maxOutChars = maxBytes / sizeof(UTF16Ch);
    const XMLSize_t countToDo = srcCount < maxOutChars ? srcCount : maxOutChars;

    //
    //  Get a pointer tot he output buffer in the UTF-16 character format
    //  that we need to work with. And get a mutable pointer to the source
    //  character buffer.
    //
    UTF16Ch*        outPtr = reinterpret_cast<UTF16Ch*>(toFill);
    const XMLCh*    srcPtr = srcData;

    //
    //  If the target format is swapped from our native format, then handle
    //  it one way, else handle it another.
    //
    if (fSwapped)
    {
        //
        //  And then do the swapping loop for the count we precalculated. Note
        //  that this also handles size conversion as well if XMLCh is not the
        //  same size as UTF16Ch.
        //
        for (XMLSize_t index = 0; index < countToDo; index++)
        {
            // To avoid flakey compilers, use a temp
            const UTF16Ch tmpCh = static_cast<UTF16Ch>(*srcPtr++);
            *outPtr++ = BitOps::swapBytes(tmpCh);
        }
    }
     else
    {
        //
        //  If XMLCh and UTF16Ch are the same size, we can just do a fast
        //  memory copy. Otherwise, we have to do a loop and downcast each
        //  character into its new 16 bit storage.
        //
        if (sizeof(XMLCh) == sizeof(UTF16Ch))
        {
            //  Notice we convert char count to byte count here!!!
            memcpy(toFill, srcData, countToDo * sizeof(UTF16Ch));
        }
         else
        {
            for (XMLSize_t index = 0; index < countToDo; index++)
                *outPtr++ = UTF16Ch(*srcPtr++);
        }
    }

    // Set the chars eaten to the calculated number we ate
    charsEaten = countToDo;

    //Return the bytes we ate. Note we convert to a byte count here!
    return countToDo * sizeof(UTF16Ch);
}